

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::MinifiedPrinter::run(MinifiedPrinter *this,Module *module)

{
  undefined1 local_1a8 [8];
  PrintSExpression print;
  
  PrintSExpression::PrintSExpression((PrintSExpression *)local_1a8,(this->super_Printer).o);
  print.o._4_1_ = 1;
  print._8_8_ = (long)"\n\r\t" + 3;
  print.maybeSpace = "";
  print.lastPrintedLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
  symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged =
       (((this->super_Printer).super_Pass.runner)->options).debugInfo;
  PrintSExpression::visitModule((PrintSExpression *)local_1a8,module);
  PrintSExpression::~PrintSExpression((PrintSExpression *)local_1a8);
  return;
}

Assistant:

void run(Module* module) override {
    PrintSExpression print(o);
    print.setMinify(true);
    print.setDebugInfo(getPassOptions().debugInfo);
    print.visitModule(module);
  }